

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderGetProgramiv3Test::iterate(GeometryShaderGetProgramiv3Test *this)

{
  GLuint *pGVar1;
  ostringstream *poVar2;
  uint uVar3;
  GLuint *pGVar4;
  _Alloc_hider _Var5;
  _Alloc_hider so_body;
  bool bVar6;
  int iVar7;
  GLuint GVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  pointer p_Var11;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  pointer p_Var12;
  undefined8 extraout_RDX;
  TestContext **ppTVar13;
  qpTestResult testResult;
  char *pcVar14;
  ulong uVar15;
  _run *run;
  ulong uVar16;
  bool bVar17;
  GLint result_geometry_linked_vertices_out;
  GLint result_geometry_shader_invocations;
  GLint result_geometry_linked_output_type;
  GLint result_geometry_linked_input_type;
  GLint gs_spo_id;
  string gs_code_specialized;
  char *gs_code_raw;
  string gs_code;
  string dummy_vs_specialized;
  string dummy_fs_specialized;
  int local_274;
  TestContext **local_270;
  uint local_264;
  int local_260;
  GLenum local_25c;
  GLenum local_258;
  int local_254;
  GLuint *local_250;
  GLuint *local_248;
  GLuint *local_240;
  string local_238;
  pointer local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar10;
  
  iVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  local_254 = 0;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x3ce);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  TestCaseBase::specializeShader_abi_cxx11_(&local_1d0,&this->super_TestCaseBase,1,&dummy_fs_code);
  so_body._M_p = local_1d0._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_(&local_1f0,&this->super_TestCaseBase,1,&dummy_vs_code);
  _Var5._M_p = local_1f0._M_dataplus._M_p;
  GVar8 = (**(code **)(lVar10 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar8;
  GVar8 = (**(code **)(lVar10 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar8;
  GVar8 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar8;
  dVar9 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar9,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x3dd);
  bVar6 = buildShader(this,this->m_fs_id,so_body._M_p);
  if ((bVar6) && (bVar6 = buildShader(this,this->m_vs_id,_Var5._M_p), bVar6)) {
    GVar8 = (**(code **)(lVar10 + 0x3c8))();
    this->m_po_id = GVar8;
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x3ea);
    (**(code **)(lVar10 + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(lVar10 + 0x10))(this->m_po_id,this->m_gs_id);
    (**(code **)(lVar10 + 0x10))(this->m_po_id,this->m_vs_id);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glAttachShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x3ef);
    bVar6 = buildShaderProgram(this,&this->m_fs_po_id,0x8b30,so_body._M_p);
    if (!bVar6) {
LAB_00cf0a0c:
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Either FS or VS SPOs failed to build.",0x25);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00cf0982;
    }
    pcVar14 = (char *)&this->m_vs_po_id;
    local_240 = (GLuint *)pcVar14;
    bVar6 = buildShaderProgram(this,(GLuint *)pcVar14,0x8b31,_Var5._M_p);
    if (!bVar6) goto LAB_00cf0a0c;
    initTestRuns(this);
    local_250 = &this->m_gs_po_id;
    local_270 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
    p_Var11 = (this->_runs).
              super__Vector_base<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var12 = (this->_runs).
              super__Vector_base<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_264 = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    bVar6 = true;
    local_248 = &this->m_fs_po_id;
    do {
      bVar17 = p_Var12 != p_Var11;
      p_Var12 = p_Var11;
      if (bVar17) {
        uVar15 = 0;
        uVar16 = 1;
        do {
          run = p_Var11 + uVar15;
          getGSCode_abi_cxx11_(&local_210,(GeometryShaderGetProgramiv3Test *)pcVar14,run);
          local_218 = local_210._M_dataplus._M_p;
          TestCaseBase::specializeShader_abi_cxx11_
                    (&local_238,&this->super_TestCaseBase,1,&local_218);
          _Var5._M_p = local_238._M_dataplus._M_p;
          if ((local_264 & 1) == 0) {
            iVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])()
            ;
            if (*local_250 != 0) {
              (**(code **)(CONCAT44(extraout_var_00,iVar7) + 0x448))();
              *local_250 = 0;
            }
            bVar17 = buildShaderProgram(this,local_250,0x8dd9,_Var5._M_p);
            if (!bVar17) {
              local_1b0._0_8_ = (*local_270)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0 + 8),
                         "Failed to compile a geometry shader program object",0x32);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00cf0755;
            }
LAB_00cf0239:
            GVar8 = (&this->m_gs_po_id)[(ulong)(local_264 & 1) * 2];
            local_274 = 0;
            local_258 = 0;
            local_25c = 0;
            local_260 = 0;
            (**(code **)(lVar10 + 0x9d8))
                      (GVar8,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT,
                       &local_274);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,
                            "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_VERTICES_OUT_EXT query."
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x44d);
            (**(code **)(lVar10 + 0x9d8))
                      (GVar8,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE,
                       &local_258);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,
                            "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query."
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x451);
            (**(code **)(lVar10 + 0x9d8))
                      (GVar8,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE,
                       &local_25c);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,
                            "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query."
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x455);
            (**(code **)(lVar10 + 0x9d8))
                      (GVar8,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS,
                       &local_260);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            pcVar14 = "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.";
            glu::checkError(dVar9,
                            "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query."
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x459);
            if (run->input_primitive_type != local_258) {
              local_1b0._0_8_ = (*local_270)->m_log;
              poVar2 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query value ",0x2e);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[",1);
              std::ostream::operator<<(poVar2,local_258);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"] does not match the test run setting [",0x27);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              pcVar14 = &std::__cxx11::ostringstream::VTT;
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              std::ios_base::~ios_base(local_138);
              bVar6 = false;
            }
            if (run->invocations != local_260) {
              local_1b0._0_8_ = (*local_270)->m_log;
              poVar2 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"GL_GEOMETRY_SHADER_INVOCATIONS_EXT query value ",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[",1);
              std::ostream::operator<<(poVar2,local_260);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"] does not match the test run setting [",0x27);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              pcVar14 = &std::__cxx11::ostringstream::VTT;
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              std::ios_base::~ios_base(local_138);
              bVar6 = false;
            }
            if (run->max_vertices != local_274) {
              local_1b0._0_8_ = (*local_270)->m_log;
              poVar2 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"GL_GEOMETRY_LINKED_VERTICES_OUT query value ",0x2c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[",1);
              std::ostream::operator<<(poVar2,local_274);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"] does not match the test run setting [",0x27);
              std::ostream::operator<<(poVar2,run->max_vertices);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              pcVar14 = &std::__cxx11::ostringstream::VTT;
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              std::ios_base::~ios_base(local_138);
              bVar6 = false;
            }
            if (run->output_primitive_type != local_25c) {
              local_1b0._0_8_ = (*local_270)->m_log;
              poVar2 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query value ",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[",1);
              std::ostream::operator<<(poVar2,local_25c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"] does not match the test run setting [",0x27);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              pcVar14 = &std::__cxx11::ostringstream::VTT;
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              std::ios_base::~ios_base(local_138);
              bVar6 = false;
            }
            bVar17 = true;
          }
          else {
            (**(code **)(lVar10 + 0x98))(0);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,"glBindProgramPipeline() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x422);
            bVar17 = buildShader(this,this->m_gs_id,_Var5._M_p);
            if (bVar17) {
              local_274 = 0;
              (**(code **)(lVar10 + 0xce8))(this->m_po_id);
              dVar9 = (**(code **)(lVar10 + 0x800))();
              glu::checkError(dVar9,"glLinkProgram() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x432);
              (**(code **)(lVar10 + 0x9d8))(this->m_po_id,0x8b82,&local_274);
              if (local_274 != 0) {
                (**(code **)(lVar10 + 0x1680))(this->m_po_id);
                dVar9 = (**(code **)(lVar10 + 0x800))();
                glu::checkError(dVar9,"glUseProgram() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                                ,0x441);
                goto LAB_00cf0239;
              }
              local_1b0._0_8_ = (*local_270)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0 + 8),"Test program object failed to link",0x22);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            else {
              local_1b0._0_8_ = (*local_270)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0 + 8),"Failed to compile a geometry shader object.",
                         0x2b);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
LAB_00cf0755:
            pcVar14 = &std::__cxx11::ostringstream::VTT;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
            std::ios_base::~ios_base(local_138);
            bVar6 = false;
            bVar17 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            pcVar14 = (char *)(local_238.field_2._M_allocated_capacity + 1);
            operator_delete(local_238._M_dataplus._M_p,(ulong)pcVar14);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            pcVar14 = (char *)(local_210.field_2._M_allocated_capacity + 1);
            operator_delete(local_210._M_dataplus._M_p,(ulong)pcVar14);
          }
          if (!bVar17) goto LAB_00cf0a55;
          p_Var11 = (this->_runs).
                    super__Vector_base<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var12 = (this->_runs).
                    super__Vector_base<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          bVar17 = uVar16 < (ulong)((long)p_Var12 - (long)p_Var11 >> 4);
          uVar15 = uVar16;
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (bVar17);
      }
      uVar3 = local_264 & 1;
      local_264 = 0;
    } while (uVar3 != 0);
    pGVar1 = &this->m_pipeline_object_id;
    (**(code **)(lVar10 + 0x6d8))(1,pGVar1);
    pGVar4 = local_248;
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGenProgramPipelines() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x490);
    (**(code **)(lVar10 + 0x1688))(*pGVar1,2,*pGVar4);
    (**(code **)(lVar10 + 0x1688))(*pGVar1,1,*local_240);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glUseProgramStages() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x494);
    (**(code **)(lVar10 + 0x9a0))
              (this->m_pipeline_object_id,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER,
               &local_254);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGetProgramPipelineiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x497);
    if (local_254 != 0) {
      local_1b0._0_8_ = (*local_270)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Pipeline object reported [",0x1a);
      std::ostream::operator<<(poVar2,local_254);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 " for GL_GEOMETRY_SHADER_EXT query, even though no GS SPO was bound.",0x43);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00cf0982;
    }
LAB_00cf0a55:
    if (bVar6) {
      pcVar14 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      ppTVar13 = local_270;
      goto LAB_00cf09ae;
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Either FS or VS failed to build.",0x20);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00cf0982:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
  pcVar14 = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
  ppTVar13 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
LAB_00cf09ae:
  tcu::TestContext::setTestResult(*ppTVar13,testResult,pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetProgramiv3Test::iterate()
{
	const glw::Functions& gl					  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gs_spo_id				  = 0;
	unsigned int		  n_run					  = 0;
	unsigned int		  n_separable_object_case = 0;
	bool				  result				  = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Prepare specialized versions of dummy fragment & vertex shaders */
	std::string dummy_fs_specialized = specializeShader(1,
														/* parts */ &dummy_fs_code);
	const char* dummy_fs_specialized_raw = dummy_fs_specialized.c_str();
	std::string dummy_vs_specialized	 = specializeShader(1, &dummy_vs_code);
	const char* dummy_vs_specialized_raw = dummy_vs_specialized.c_str();

	/* Set up the fragment & the vertex shaders */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	if (!buildShader(m_fs_id, dummy_fs_specialized_raw) || !buildShader(m_vs_id, dummy_vs_specialized_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Either FS or VS failed to build." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up the test program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_gs_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	/* Set up the fragment & the vertex shader programs */
	if (!buildShaderProgram(&m_fs_po_id, GL_FRAGMENT_SHADER, dummy_fs_specialized_raw) ||
		!buildShaderProgram(&m_vs_po_id, GL_VERTEX_SHADER, dummy_vs_specialized_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Either FS or VS SPOs failed to build."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up test runs */
	initTestRuns();

	/* The test should check both a geometry shader program object and a full-blown PO
	 * consisting of FS, GS and VS. */
	for (n_separable_object_case = 0; n_separable_object_case < 2; /* PO, SPO cases */
		 ++n_separable_object_case)
	{
		bool should_use_separable_object = (n_separable_object_case != 0);

		/* Iterate over all test runs */
		for (n_run = 0; n_run < _runs.size(); ++n_run)
		{
			const _run& current_run			= _runs[n_run];
			std::string gs_code				= getGSCode(current_run);
			const char* gs_code_raw			= gs_code.c_str();
			std::string gs_code_specialized = specializeShader(1, /* parts */
															   &gs_code_raw);
			const char* gs_code_specialized_raw = gs_code_specialized.c_str();

			if (should_use_separable_object)
			{
				/* Deinitialize any objects that may have been created in previous iterations */
				deinitSPOs(false);

				/* Set up the geometry shader program object */
				if (!buildShaderProgram(&m_gs_po_id, GL_GEOMETRY_SHADER, gs_code_specialized_raw))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Failed to compile a geometry shader program object"
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}
			} /* if (should_use_pipeline_object) */
			else
			{
				gl.bindProgramPipeline(0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

				/* Set up the geometry shader object */
				if (!buildShader(m_gs_id, gs_code_specialized_raw))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Failed to compile a geometry shader object."
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}

				/* Set up the program object */
				glw::GLint link_status = GL_FALSE;

				gl.linkProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

				gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);

				if (link_status == GL_FALSE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Test program object failed to link"
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}

				/* Bind the PO to the rendering context */
				gl.useProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
			}

			/* Execute the queries */
			glw::GLuint po_id								= (should_use_separable_object) ? m_gs_po_id : m_po_id;
			glw::GLint  result_geometry_linked_vertices_out = 0;
			glw::GLint  result_geometry_linked_input_type   = 0;
			glw::GLint  result_geometry_linked_output_type  = 0;
			glw::GLint  result_geometry_shader_invocations  = 0;

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT, &result_geometry_linked_vertices_out);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_VERTICES_OUT_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE, &result_geometry_linked_input_type);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE, &result_geometry_linked_output_type);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS, &result_geometry_shader_invocations);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.");

			if (current_run.input_primitive_type != (glw::GLenum)result_geometry_linked_input_type)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query value "
								   << "[" << result_geometry_linked_input_type
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.input_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.invocations != result_geometry_shader_invocations)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_SHADER_INVOCATIONS_EXT query value "
								   << "[" << result_geometry_shader_invocations
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.input_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.max_vertices != result_geometry_linked_vertices_out)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_VERTICES_OUT query value "
								   << "[" << result_geometry_linked_vertices_out
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.max_vertices << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.output_primitive_type != (glw::GLenum)result_geometry_linked_output_type)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query value "
								   << "[" << result_geometry_linked_output_type
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.output_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all test runs) */
	}	 /* for (PO & SPO cases) */

	/* One more check: build a pipeline object which only defines a FS & VS stages,
	 *                 and check what GS SPO ID the object reports. */
	gl.genProgramPipelines(1, &m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.useProgramStages(m_pipeline_object_id, GL_FRAGMENT_SHADER_BIT, m_fs_po_id);
	gl.useProgramStages(m_pipeline_object_id, GL_VERTEX_SHADER_BIT, m_vs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

	gl.getProgramPipelineiv(m_pipeline_object_id, m_glExtTokens.GEOMETRY_SHADER, &gs_spo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

	if (gs_spo_id != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Pipeline object reported [" << gs_spo_id << "]"
						   << " for GL_GEOMETRY_SHADER_EXT query, even though no GS SPO was bound."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}